

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O2

double __thiscall agg::bspline::get_stateful(bspline *this,double x)

{
  int *__nmemb;
  double *__base;
  uint uVar1;
  size_t in_RCX;
  uint i;
  void *__key;
  __compar_fn_t in_R8;
  double dVar2;
  
  __key = (void *)(long)this->m_num;
  if ((long)__key < 3) {
    return 0.0;
  }
  __base = this->m_x;
  if (x < *__base) {
    dVar2 = extrapolation_left(this,x);
    return dVar2;
  }
  if (__base[(long)__key + -1] <= x) {
    dVar2 = extrapolation_right(this,x);
    return dVar2;
  }
  __nmemb = &this->m_last_idx;
  i = this->m_last_idx;
  if ((int)i < 0) {
    bsearch(__key,__base,(size_t)__nmemb,in_RCX,in_R8);
    i = this->m_last_idx;
    goto LAB_00110f65;
  }
  if ((__base[i] <= x) && (x < __base[(ulong)i + 1] || x == __base[(ulong)i + 1]))
  goto LAB_00110f65;
  uVar1 = this->m_num - 2;
  if (i < uVar1) {
    if ((x < __base[(ulong)i + 1]) || (__base[(ulong)i + 2] < x)) {
      if (i != 0) goto LAB_00110f04;
      goto LAB_00110f42;
    }
    i = i + 1;
  }
  else {
LAB_00110f04:
    if ((__base[i] < x) || (x < __base[(ulong)i - 1])) {
LAB_00110f42:
      bsearch(__key,__base,(size_t)__nmemb,(ulong)uVar1,in_R8);
      i = *__nmemb;
      goto LAB_00110f65;
    }
    i = i - 1;
  }
  *__nmemb = i;
LAB_00110f65:
  dVar2 = interpolation(this,x,i);
  return dVar2;
}

Assistant:

double bspline::get_stateful(double x) const
    {
        if(m_num > 2)
        {
            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            if(m_last_idx >= 0)
            {
                // Check if x is not in current range
                if(x < m_x[m_last_idx] || x > m_x[m_last_idx + 1])
                {
                    // Check if x between next points (most probably)
                    if(m_last_idx < m_num - 2 && 
                       x >= m_x[m_last_idx + 1] &&
                       x <= m_x[m_last_idx + 2])
                    {
                        ++m_last_idx;
                    }
                    else
                    if(m_last_idx > 0 && 
                       x >= m_x[m_last_idx - 1] && 
                       x <= m_x[m_last_idx])
                    {
                        // x is between pevious points
                        --m_last_idx;
                    }
                    else
                    {
                        // Else perform full search
                        bsearch(m_num, m_x, x, &m_last_idx);
                    }
                }
                return interpolation(x, m_last_idx);
            }
            else
            {
                // Interpolation
                bsearch(m_num, m_x, x, &m_last_idx);
                return interpolation(x, m_last_idx);
            }
        }
        return 0.0;
    }